

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRReader.cpp
# Opt level: O1

Barcode * __thiscall
ZXing::QRCode::Reader::decode(Barcode *__return_storage_ptr__,Reader *this,BinaryBitmap *image)

{
  uint uVar1;
  pointer pRVar2;
  pointer pEVar3;
  BitMatrix *image_00;
  BarcodeFormat format;
  BarcodeFormat BVar4;
  DecoderResult decoderResult;
  undefined8 local_128;
  pointer pRStack_120;
  pointer local_118;
  pointer pEStack_110;
  PointT<int> local_108;
  PointT<int> PStack_100;
  PointT<int> local_f8;
  PointT<int> PStack_f0;
  undefined1 local_e8 [56];
  PointT<int> PStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0 [2];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  if ((undefined1  [12])((undefined1  [12])*(this->super_Reader)._opts & (undefined1  [12])0x10) ==
      (undefined1  [12])0x0) {
    (*(this->super_Reader)._vptr_Reader[3])
              ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)local_e8,this,image,1);
    FirstOrDefault<std::vector,_ZXing::Result,_std::allocator<ZXing::Result>_>
              (__return_storage_ptr__,
               (vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)local_e8);
    std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
              ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)local_e8);
  }
  else {
    image_00 = BinaryBitmap::getBitMatrix(image);
    if (image_00 == (BitMatrix *)0x0) {
      memset(__return_storage_ptr__,0,0xd8);
      Result::Result(__return_storage_ptr__);
    }
    else {
      local_f8.x = 0;
      local_f8.y = 0;
      PStack_f0.x = 0;
      PStack_f0.y = 0;
      local_108.x = 0;
      local_108.y = 0;
      PStack_100.x = 0;
      PStack_100.y = 0;
      local_118 = (pointer)0x0;
      pEStack_110 = (pointer)0x0;
      local_128 = (pointer)0x0;
      pRStack_120 = (pointer)0x0;
      uVar1 = (((this->super_Reader)._opts)->_formats).i;
      if (uVar1 == 0 || (uVar1 >> 0xd & 1) != 0) {
        DetectPureQR((DetectorResult *)local_e8,image_00);
        pEVar3 = pEStack_110;
        pRVar2 = pRStack_120;
        local_128 = (pointer)local_e8._0_8_;
        pRStack_120 = (pointer)local_e8._8_8_;
        local_118 = (pointer)local_e8._16_8_;
        pEStack_110 = (pointer)local_e8._24_8_;
        local_e8._8_8_ = (pointer)0x0;
        local_e8._16_8_ = (pointer)0x0;
        local_e8._24_8_ = (pointer)0x0;
        if (pRVar2 != (pointer)0x0) {
          operator_delete(pRVar2,(long)pEVar3 - (long)pRVar2);
        }
        local_f8.x = local_e8._48_4_;
        local_f8.y = local_e8._52_4_;
        PStack_f0 = PStack_b0;
        local_108.x = local_e8._32_4_;
        local_108.y = local_e8._36_4_;
        PStack_100.x = local_e8._40_4_;
        PStack_100.y = local_e8._44_4_;
        if ((pointer)local_e8._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_e8._8_8_,local_e8._24_8_ - local_e8._8_8_);
        }
      }
      uVar1 = (((this->super_Reader)._opts)->_formats).i;
      if ((uVar1 == 0 || (uVar1 >> 0x10 & 1) != 0) && (pRStack_120 == local_118)) {
        DetectPureMQR((DetectorResult *)local_e8,image_00);
        pEVar3 = pEStack_110;
        pRVar2 = pRStack_120;
        local_128 = (pointer)local_e8._0_8_;
        pRStack_120 = (pointer)local_e8._8_8_;
        local_118 = (pointer)local_e8._16_8_;
        pEStack_110 = (pointer)local_e8._24_8_;
        local_e8._8_8_ = (pointer)0x0;
        local_e8._16_8_ = (pointer)0x0;
        local_e8._24_8_ = (pointer)0x0;
        if (pRVar2 != (pointer)0x0) {
          operator_delete(pRVar2,(long)pEVar3 - (long)pRVar2);
        }
        local_f8.x = local_e8._48_4_;
        local_f8.y = local_e8._52_4_;
        PStack_f0 = PStack_b0;
        local_108.x = local_e8._32_4_;
        local_108.y = local_e8._36_4_;
        PStack_100.x = local_e8._40_4_;
        PStack_100.y = local_e8._44_4_;
        if ((pointer)local_e8._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_e8._8_8_,local_e8._24_8_ - local_e8._8_8_);
        }
      }
      uVar1 = (((this->super_Reader)._opts)->_formats).i;
      if ((uVar1 == 0 || (uVar1 >> 0x11 & 1) != 0) && (pRStack_120 == local_118)) {
        DetectPureRMQR((DetectorResult *)local_e8,image_00);
        pEVar3 = pEStack_110;
        pRVar2 = pRStack_120;
        local_128 = (pointer)local_e8._0_8_;
        pRStack_120 = (pointer)local_e8._8_8_;
        local_118 = (pointer)local_e8._16_8_;
        pEStack_110 = (pointer)local_e8._24_8_;
        local_e8._8_8_ = (pointer)0x0;
        local_e8._16_8_ = (pointer)0x0;
        local_e8._24_8_ = (pointer)0x0;
        if (pRVar2 != (pointer)0x0) {
          operator_delete(pRVar2,(long)pEVar3 - (long)pRVar2);
        }
        local_f8.x = local_e8._48_4_;
        local_f8.y = local_e8._52_4_;
        PStack_f0 = PStack_b0;
        local_108.x = local_e8._32_4_;
        local_108.y = local_e8._36_4_;
        PStack_100.x = local_e8._40_4_;
        PStack_100.y = local_e8._44_4_;
        if ((pointer)local_e8._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_e8._8_8_,local_e8._24_8_ - local_e8._8_8_);
        }
      }
      if (pRStack_120 == local_118) {
        memset(__return_storage_ptr__,0,0xd8);
        Result::Result(__return_storage_ptr__);
      }
      else {
        Decode((DecoderResult *)local_e8,(BitMatrix *)&local_128);
        BVar4 = QRCode;
        if ((int)local_128 < 0x15) {
          BVar4 = MicroQRCode;
        }
        format = RMQRCode;
        if ((int)local_128 == local_128._4_4_) {
          format = BVar4;
        }
        Result::Result(__return_storage_ptr__,(DecoderResult *)local_e8,(DetectorResult *)&local_128
                       ,format);
        if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_p != local_48) {
          operator_delete(local_58._M_p,local_48[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_p != &local_70) {
          operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
        }
        if (PStack_b0 != (PointT<int>)local_a0) {
          operator_delete((void *)PStack_b0,local_a0[0]._M_allocated_capacity + 1);
        }
        if ((pointer)local_e8._24_8_ != (pointer)0x0) {
          operator_delete((void *)local_e8._24_8_,local_e8._40_8_ - local_e8._24_8_);
        }
        if ((pointer)local_e8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_e8._0_8_,local_e8._16_8_ - local_e8._0_8_);
        }
      }
      if (pRStack_120 != (pointer)0x0) {
        operator_delete(pRStack_120,(long)pEStack_110 - (long)pRStack_120);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Barcode Reader::decode(const BinaryBitmap& image) const
{
#if 1
	if (!_opts.isPure())
		return FirstOrDefault(decode(image, 1));
#endif

	auto binImg = image.getBitMatrix();
	if (binImg == nullptr)
		return {};

	DetectorResult detectorResult;
	if (_opts.hasFormat(BarcodeFormat::QRCode))
		detectorResult = DetectPureQR(*binImg);
	if (_opts.hasFormat(BarcodeFormat::MicroQRCode) && !detectorResult.isValid())
		detectorResult = DetectPureMQR(*binImg);
	if (_opts.hasFormat(BarcodeFormat::RMQRCode) && !detectorResult.isValid())
		detectorResult = DetectPureRMQR(*binImg);

	if (!detectorResult.isValid())
		return {};

	auto decoderResult = Decode(detectorResult.bits());
	auto format = detectorResult.bits().width() != detectorResult.bits().height() ? BarcodeFormat::RMQRCode
				  : detectorResult.bits().width() < 21                            ? BarcodeFormat::MicroQRCode
																				  : BarcodeFormat::QRCode;

	return Barcode(std::move(decoderResult), std::move(detectorResult), format);
}